

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmmd.cpp
# Opt level: O3

void __thiscall image_match::rgb2hmmd_pixel_inplace(image_match *this,pixel p)

{
  image_match iVar1;
  image_match iVar2;
  image_match iVar3;
  image_match iVar4;
  image_match *piVar5;
  image_match iVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  image_match *piVar10;
  image_match iVar11;
  
  uVar9 = (long)p.first_ - (long)this;
  if (((image_match *)p.first_ != this) && (1 < uVar9)) {
    iVar4 = *this;
    iVar1 = this[1];
    iVar11 = iVar1;
    if ((byte)iVar4 < (byte)iVar1) {
      iVar11 = iVar4;
    }
    if (uVar9 != 2) {
      iVar2 = this[2];
      if ((byte)iVar2 <= (byte)iVar11) {
        iVar11 = iVar2;
      }
      piVar10 = this + 2;
      if ((byte)iVar2 < (byte)iVar1) {
        piVar10 = this + 1;
      }
      piVar5 = this + (ulong)((byte)iVar4 <= (byte)iVar2) * 2;
      if ((byte)iVar4 <= (byte)iVar1) {
        piVar5 = piVar10;
      }
      iVar3 = *piVar5;
      iVar8 = (uint)(byte)iVar3 - (uint)(byte)iVar11;
      iVar6 = SUB41(iVar8,0);
      if (iVar6 == (image_match)0x0) {
        iVar4 = (image_match)0x0;
      }
      else {
        sVar7 = (short)iVar8;
        if (iVar3 == iVar4) {
          iVar4 = SUB21((short)(((ushort)(byte)iVar1 - (ushort)(byte)iVar2) * 0x2b) / sVar7,0);
        }
        else if (iVar3 == iVar1) {
          iVar4 = (image_match)
                  ((char)((short)(((ushort)(byte)iVar2 - (ushort)(byte)iVar4) * 0x2b) / sVar7) + 'U'
                  );
        }
        else {
          iVar4 = (image_match)
                  ((char)((short)(((ushort)(byte)iVar4 - (ushort)(byte)iVar1) * 0x2b) / sVar7) +
                  -0x55);
        }
      }
      *this = iVar4;
      this[1] = SUB41((uint)(byte)iVar3 + (uint)(byte)iVar11 >> 1,0);
      this[2] = iVar6;
      return;
    }
  }
  gsl::detail::fail_fast_terminate();
}

Assistant:

void
rgb2hmmd_pixel_inplace(pixel p)
{
    pixel::value_type min, max;

    min =
      p[0] < p[1] ? (p[0] < p[2] ? p[0] : p[2]) : (p[1] < p[2] ? p[1] : p[2]);
    max =
      p[0] > p[1] ? (p[0] > p[2] ? p[0] : p[2]) : (p[1] > p[2] ? p[1] : p[2]);

    pixel::value_type sum, diff, hue;
    diff = max - min;
    sum = static_cast<pixel::value_type>(
      (static_cast<int>(max) + static_cast<int>(min)) >> 1);
    hue = 0;

    // Hue is defined same as in HSV
    if (diff) {
        if (max == p[0])
            hue = 43 * (p[1] - p[2]) / (max - min);
        else if (max == p[1])
            hue = 85 + 43 * (p[2] - p[0]) / (max - min);
        else
            hue = 171 + 43 * (p[0] - p[1]) / (max - min);
    }

    p[0] = hue;
    p[1] = sum;
    p[2] = diff;
}